

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

bool __thiscall LTACMasterdataChannel::InsertRequest(LTACMasterdataChannel *this,acStatUpdateTy *r)

{
  _Rb_tree_header *p_Var1;
  DatRequTy DVar2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  byte bVar8;
  pair<std::_Rb_tree_iterator<acStatUpdateTy>,_bool> pVar9;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&mtxMaster);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  p_Var7 = (this->setAcStatRequ)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->setAcStatRequ)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    DVar2 = r->type;
    _Var3 = (r->acKey).eKeyType;
    p_Var4 = (_Base_ptr)(r->acKey).num;
    do {
      if (((*(DatRequTy *)&p_Var7[3]._M_right == DVar2) && (p_Var7[1]._M_color == _Var3)) &&
         (p_Var7[2]._M_parent == p_Var4)) break;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    pVar9 = std::
            _Rb_tree<acStatUpdateTy,acStatUpdateTy,std::_Identity<acStatUpdateTy>,std::less<acStatUpdateTy>,std::allocator<acStatUpdateTy>>
            ::_M_insert_unique<acStatUpdateTy_const&>
                      ((_Rb_tree<acStatUpdateTy,acStatUpdateTy,std::_Identity<acStatUpdateTy>,std::less<acStatUpdateTy>,std::allocator<acStatUpdateTy>>
                        *)&this->setAcStatRequ,r);
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      bVar5 = true;
    }
    else {
      std::condition_variable::notify_all();
      r = (acStatUpdateTy *)0x1;
      bVar5 = false;
    }
  }
  else {
    bVar5 = false;
    r = (acStatUpdateTy *)0x0;
  }
  bVar8 = (byte)r;
  pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
  if (bVar5) {
    bVar8 = 0;
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool LTACMasterdataChannel::InsertRequest (const acStatUpdateTy& r)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        
        // Avoid double entry: Bail if the same kind of request exists already
        // This is different from the duplication check that std::set::insert does
        // because it uses operator== (ignoring `distance`) instead operator<
        if (std::find(setAcStatRequ.begin(), setAcStatRequ.end(), r) != setAcStatRequ.end())
            return false;
        
        // Add the new request to the set and trigger the main loop if really inserted
        if (setAcStatRequ.insert(r).second) {
            FDThreadSynchCV.notify_all();
            return true;
        }
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
    return false;

}